

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.h
# Opt level: O0

void assert_fp_access_checked(DisasContext_conflict1 *s)

{
  DisasContext_conflict1 *s_local;
  
  return;
}

Assistant:

static inline void assert_fp_access_checked(DisasContext *s)
{
#ifdef CONFIG_DEBUG_TCG
    if (unlikely(!s->fp_access_checked || s->fp_excp_el)) {
        fprintf(stderr, "target-arm: FP access check missing for "
                "instruction 0x%08x\n", s->insn);
        abort();
    }
#endif
}